

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void playing_volume_setup(DUMB_IT_SIGRENDERER *sigrenderer,IT_PLAYING *playing,float invt2g)

{
  int iVar1;
  DUMB_IT_SIGDATA *pDVar2;
  int iVar3;
  IT_PLAYING *in_RSI;
  DUMB_IT_SIGRENDERER *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  int ramp_style;
  float rampScale;
  float span;
  float vol;
  int pan;
  DUMB_IT_SIGDATA *sigdata;
  float local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  pDVar2 = in_RDI->sigdata;
  iVar1 = in_RDI->ramp_style;
  iVar3 = apply_pan_envelope((IT_PLAYING *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (((in_RDI->n_channels < 2) || ((pDVar2->flags & 1U) == 0)) ||
     ((in_RDI->n_channels == 3 && (0x4000 < iVar3)))) {
    in_RSI->float_volume[0] = 1.0;
    in_RSI->float_volume[1] = 1.0;
  }
  else if (iVar3 < 0x4001) {
    fVar4 = (1.0 - (float)((iVar3 + -0x2000) * pDVar2->pan_separation) * 9.536743e-07) * 0.5;
    in_RSI->float_volume[0] = fVar4;
    in_RSI->float_volume[1] = 1.0 - fVar4;
  }
  else {
    in_RSI->float_volume[0] = -0.5;
    in_RSI->float_volume[1] = 0.5;
  }
  fVar4 = calculate_volume(in_RDI,in_RSI,(double)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8));
  in_RSI->float_volume[0] = fVar4 * in_RSI->float_volume[0];
  in_RSI->float_volume[1] = fVar4 * in_RSI->float_volume[1];
  local_30 = 4.0;
  if (((0 < iVar1) && (in_RSI->declick_stage == '\x02')) &&
     (((in_RSI->ramp_volume[0] == 0.0 &&
       (((!NAN(in_RSI->ramp_volume[0]) && (in_RSI->ramp_volume[1] == 0.0)) &&
        (!NAN(in_RSI->ramp_volume[1]))))) || ((fVar4 == 0.0 && (!NAN(fVar4))))))) {
    local_30 = 48.0;
  }
  if ((iVar1 == 0) || ((iVar1 < 2 && (in_RSI->declick_stage == '\x02')))) {
    if (in_RSI->declick_stage < 3) {
      in_RSI->ramp_volume[0] = in_RSI->float_volume[0];
      in_RSI->ramp_volume[1] = in_RSI->float_volume[1];
      in_RSI->declick_stage = '\x02';
    }
    else {
      in_RSI->float_volume[0] = 0.0;
      in_RSI->float_volume[1] = 0.0;
      in_RSI->ramp_volume[0] = 0.0;
      in_RSI->ramp_volume[1] = 0.0;
      in_RSI->declick_stage = '\x05';
    }
    in_RSI->ramp_delta[0] = 0.0;
    in_RSI->ramp_delta[1] = 0.0;
  }
  else {
    if (in_RSI->declick_stage == '\0') {
      in_RSI->ramp_volume[0] = 0.0;
      in_RSI->ramp_volume[1] = 0.0;
      local_30 = 48.0;
      in_RSI->declick_stage = in_RSI->declick_stage + '\x01';
    }
    else if (in_RSI->declick_stage == '\x01') {
      local_30 = 48.0;
    }
    else if (2 < in_RSI->declick_stage) {
      in_RSI->float_volume[0] = 0.0;
      in_RSI->float_volume[1] = 0.0;
      if (in_RSI->declick_stage == '\x03') {
        in_RSI->declick_stage = in_RSI->declick_stage + '\x01';
      }
      local_30 = 48.0;
    }
    in_RSI->ramp_delta[0] =
         local_30 * in_XMM0_Da * (in_RSI->float_volume[0] - in_RSI->ramp_volume[0]);
    in_RSI->ramp_delta[1] =
         local_30 * in_XMM0_Da * (in_RSI->float_volume[1] - in_RSI->ramp_volume[1]);
  }
  return;
}

Assistant:

static void playing_volume_setup(DUMB_IT_SIGRENDERER * sigrenderer, IT_PLAYING * playing, float invt2g)
{
	DUMB_IT_SIGDATA * sigdata = sigrenderer->sigdata;
	int pan;
	float vol, span;
    float rampScale;
    int ramp_style = sigrenderer->ramp_style;
 
	pan = apply_pan_envelope(playing);

	if ((sigrenderer->n_channels >= 2) && (sigdata->flags & IT_STEREO) && (sigrenderer->n_channels != 3 || !IT_IS_SURROUND_SHIFTED(pan))) {
		if (!IT_IS_SURROUND_SHIFTED(pan)) {
			span = (pan - (32<<8)) * sigdata->pan_separation * (1.0f / ((32<<8) * 128));
			vol = 0.5f * (1.0f - span);
			playing->float_volume[0] = vol;
			playing->float_volume[1] = 1.0f - vol;
		} else {
			playing->float_volume[0] = -0.5f;
			playing->float_volume[1] = 0.5f;
		}
 	} else {
		playing->float_volume[0] = 1.0f;
		playing->float_volume[1] = 1.0f;
	}

	vol = calculate_volume(sigrenderer, playing, 1.0f);
	playing->float_volume[0] *= vol;
	playing->float_volume[1] *= vol;
    
    rampScale = 4;

    if (ramp_style > 0 && playing->declick_stage == 2) {
        if ((playing->ramp_volume[0] == 0 && playing->ramp_volume[1] == 0) || vol == 0)
            rampScale = 48;
    }

    if (ramp_style == 0 || (ramp_style < 2 && playing->declick_stage == 2)) {
		if (playing->declick_stage <= 2) {
			playing->ramp_volume[0] = playing->float_volume[0];
			playing->ramp_volume[1] = playing->float_volume[1];
			playing->declick_stage = 2;
		} else {
			playing->float_volume[0] = 0;
			playing->float_volume[1] = 0;
			playing->ramp_volume[0] = 0;
			playing->ramp_volume[1] = 0;
			playing->declick_stage = 5;
		}
		playing->ramp_delta[0] = 0;
        playing->ramp_delta[1] = 0;
    } else {
        if (playing->declick_stage == 0) {
            playing->ramp_volume[0] = 0;
            playing->ramp_volume[1] = 0;
            rampScale = 48;
            playing->declick_stage++;
        } else if (playing->declick_stage == 1) {
            rampScale = 48;
        } else if (playing->declick_stage >= 3) {
            playing->float_volume[0] = 0;
            playing->float_volume[1] = 0;
            if (playing->declick_stage == 3)
                playing->declick_stage++;
            rampScale = 48;
        }
        playing->ramp_delta[0] = rampScale * invt2g * (playing->float_volume[0] - playing->ramp_volume[0]);
        playing->ramp_delta[1] = rampScale * invt2g * (playing->float_volume[1] - playing->ramp_volume[1]);
    }
}